

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O2

void __thiscall gvr::TexturedMesh::~TexturedMesh(TexturedMesh *this)

{
  ~TexturedMesh(this);
  operator_delete(this);
  return;
}

Assistant:

TexturedMesh::~TexturedMesh()
{
  delete [] uv;
}